

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O2

bool __thiscall Selector::callListeners(Selector *this,int fd,uint32_t events)

{
  SelectorListener *pSVar1;
  jh_ptr_int_t jVar2;
  bool bVar3;
  iterator iVar4;
  ListenerNode *pLVar5;
  bool bVar6;
  iterator listener;
  iterator local_68;
  AutoLock l;
  ListenerNode n;
  
  AutoLock::AutoLock(&l,&this->mLock);
  n.mListener = (SelectorListener *)0x0;
  iVar4.mNode = ((this->mList).mHead)->next;
  bVar6 = false;
  listener.mNode = iVar4.mNode;
  n.mFd = fd;
  while (iVar4.mNode != (this->mList).mTail) {
    bVar3 = ListenerNode::operator==((iVar4.mNode)->val,&n);
    if (bVar3) {
      pLVar5 = (listener.mNode)->val;
      pSVar1 = pLVar5->mListener;
      jVar2 = pLVar5->mPrivateData;
      if ((events & 0x30) == 0) {
        iVar4.mNode = (listener.mNode)->next;
      }
      else {
        if ((events & 0x20) != 0) {
          jh_log_print(2,"bool Selector::callListeners(int, uint32_t)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                       ,0x18a,"POLLNVAL recieved on fd = %d (%p)",fd,pLVar5);
          pLVar5 = (listener.mNode)->val;
        }
        operator_delete(pLVar5,0x18);
        JetHead::list<Selector::ListenerNode_*>::iterator::erase(&local_68);
        bVar6 = true;
        iVar4.mNode = local_68.mNode;
      }
      listener.mNode = iVar4.mNode;
      if (pSVar1 != (SelectorListener *)0x0) {
        (**pSVar1->_vptr_SelectorListener)(pSVar1,fd,(ulong)(uint)(int)(short)events,jVar2);
      }
    }
    else {
      iVar4.mNode = (Node *)0x0;
      if (listener.mNode != (Node *)0x0) {
        iVar4.mNode = (listener.mNode)->next;
        listener.mNode = iVar4.mNode;
      }
    }
  }
  AutoLock::~AutoLock(&l);
  return bVar6;
}

Assistant:

bool Selector::callListeners( int fd, uint32_t events )
{
	AutoLock l( mLock );
	TRACE_BEGIN( LOG_LVL_INFO );
	ListenerNode n( fd, NULL );
	bool result = false;
	
	JetHead::list<ListenerNode*>::iterator listener = mList.begin();
	while (listener != mList.end())
	{
		if (*(*listener) == n)
		{
			LOG( "got event %x %p", events, *listener );
		
			// We want to remove the listener from the list if 
			//  revents includes POLLHUP or POLLNVAL.  But we also
			//  need for the listener to know about these event(s).
			// A "good" listener could take care of this by 
			//  removing himself from the selector.  The lock has 
			//  been made recursive so this is possible without dead
			//  locking.  But a "bad" listener may ignore these 
			//  event entirly.  
			// So in the spirit of "doing the right thing".  We need
			//  to deal with both cases.  However once we 
			//  call the listener's callback, the listener itself
			//  might be destroyed.  But if POLLHUP or POLLNVAL
			//  was recieved and the listener has not been destroyed
			//  we must do it.
			
			// listener might be destroyed if POLLHUP or POLLNVAL
			//  events are recieved.  So we will get any data we 
			//  need from it now. 
			SelectorListener *interface = (*listener)->mListener;
			jh_ptr_int_t pd = (*listener)->mPrivateData;
		
			if ( events & ( POLLHUP | POLLNVAL ) )
			{	
				if ( events & POLLHUP )
					LOG_INFO( "POLLHUP recieved on fd = %d (%p)", fd, *listener );
				
				if ( events & POLLNVAL )
					LOG_WARN( "POLLNVAL recieved on fd = %d (%p)", fd, *listener );
								
				delete *listener;
				listener = listener.erase();

				result = true;
			}
			else
			{
				// Gets incremented by the "erase" in the other branch
				++listener;
			}
			
			if ( interface != NULL )
			{
				LOG_NOISE( "eventsCallback %p %d %d", interface, events, fd );
				interface->processFileEvents( fd, events, pd );
				LOG_NOISE( "eventsCallback done" );
			}
		} else {
			++listener;
		}
	}
	
	return result;
}